

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

double exp(double __x)

{
  Blade __position;
  vector<Blade,_std::allocator<Blade>_> *in_RSI;
  Blade *in_RDI;
  float fVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Clifford tP;
  float local_12c;
  vector<Blade,_std::allocator<Blade>_> local_128;
  Clifford local_110;
  vector<Blade,_std::allocator<Blade>_> local_f8;
  vector<Blade,_std::allocator<Blade>_> *local_e0;
  vector<Blade,_std::allocator<Blade>_> local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  vector<Blade,_std::allocator<Blade>_> local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  vector<Blade,_std::allocator<Blade>_> local_78;
  vector<Blade,_std::allocator<Blade>_> local_60;
  Clifford local_48;
  
  local_e0 = in_RSI;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_f8,in_RSI);
  in_RDI->mVal = 0.0;
  in_RDI->mBase = 0;
  in_RDI[1].mVal = 0.0;
  in_RDI[1].mBase = 0;
  in_RDI[2].mVal = 0.0;
  in_RDI[2].mBase = 0;
  Blade::Blade((Blade *)&local_128,0,1.0);
  __position = in_RDI[1];
  if (__position == in_RDI[2]) {
    std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
              ((vector<Blade,_std::allocator<Blade>_> *)in_RDI,(iterator)__position,
               (Blade *)&local_128);
  }
  else {
    *(pointer *)__position =
         local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
         ._M_start;
    in_RDI[1] = (Blade)((long)in_RDI[1] + 8);
  }
  Blade::~Blade((Blade *)&local_128);
  std::vector<Blade,_std::allocator<Blade>_>::vector
            (&local_a8,(vector<Blade,_std::allocator<Blade>_> *)in_RDI);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,local_e0);
  operator+(&local_110,&local_a8,&local_c0);
  local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)in_RDI;
  local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)(in_RDI + 1);
  local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)(in_RDI + 2);
  *in_RDI = (Blade)local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                   super__Vector_impl_data._M_start;
  in_RDI[1] = (Blade)local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  in_RDI[2] = (Blade)local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_128);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_110);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  local_12c = 2.0;
  do {
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d8,local_e0);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&local_f8);
    operator*(&local_48,&local_d8,&local_60);
    operator/(&local_110,&local_48,local_12c);
    local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_start = local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_start = local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage;
    local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_128);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_110);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
    fVar1 = 7.0;
    if (local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_f8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::vector<Blade,_std::allocator<Blade>_>::vector
                (&local_90,(vector<Blade,_std::allocator<Blade>_> *)in_RDI);
      std::vector<Blade,_std::allocator<Blade>_>::vector(&local_78,&local_f8);
      operator+(&local_110,&local_90,&local_78);
      local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)in_RDI;
      local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(in_RDI + 1);
      local_128.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)(in_RDI + 2);
      *in_RDI = (Blade)local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                       super__Vector_impl_data._M_start;
      in_RDI[1] = (Blade)local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                         super__Vector_impl_data._M_finish;
      in_RDI[2] = (Blade)local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
      local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_110.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_128);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_110);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
      fVar1 = local_12c + 1.0;
    }
    local_12c = fVar1;
  } while (fVar1 <= 6.0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f8);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

Clifford exp(Clifford& P)
{
  Clifford tP=P,R;
  R.push_back(Blade(0,1.0));
  R=R+P;  
  for(float n=2;n<=6;n++)
  {	
	tP = P * tP/n;
	if(tP.size())R=R+tP;
	else{n=6;}
  }
  return R;
}